

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeImage
                 (qpTestLog *log,char *name,char *description,qpImageCompressionMode compressionMode
                 ,qpImageFormat imageFormat,int width,int height,int stride,void *data)

{
  deBool dVar1;
  char *pcVar2;
  long lVar3;
  undefined1 local_278 [16];
  char *local_268;
  char *local_260;
  undefined1 local_258 [16];
  char *local_248;
  char *local_240;
  undefined1 local_238 [16];
  char *local_228;
  char *local_220;
  undefined1 local_218 [16];
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [16];
  char *local_1e8;
  char *local_1e0;
  undefined1 local_1d8 [16];
  char *local_1c8;
  char *local_1c0;
  int local_1b8;
  int local_1b4;
  int row;
  int packedStride;
  int pixelSize;
  deBool compressOk;
  size_t writeDataBytes;
  void *writeDataPtr;
  Buffer compressedBuffer;
  undefined1 local_178 [4];
  int numAttribs;
  qpXmlAttribute attribs [8];
  char heightStr [32];
  char widthStr [32];
  int width_local;
  qpImageFormat imageFormat_local;
  qpImageCompressionMode compressionMode_local;
  char *description_local;
  char *name_local;
  qpTestLog *log_local;
  
  compressedBuffer.data._4_4_ = 0;
  writeDataBytes = 0;
  _pixelSize = 0xffffffffffffffff;
  if ((log->flags & 1) == 0) {
    Buffer_init((Buffer *)&writeDataPtr);
    width_local = compressionMode;
    if (compressionMode == QP_IMAGE_COMPRESSION_MODE_BEST) {
      width_local = 1;
    }
    if (width_local == 1) {
      packedStride = compressImagePNG((Buffer *)&writeDataPtr,imageFormat,width,height,stride,data);
      if (packedStride == 0) {
        qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
        width_local = 0;
      }
      else {
        writeDataBytes = compressedBuffer.size;
        _pixelSize = compressedBuffer.capacity;
      }
    }
    if (width_local == 0) {
      row = 4;
      if (imageFormat == QP_IMAGE_FORMAT_RGB888) {
        row = 3;
      }
      local_1b4 = row * width;
      if (local_1b4 == stride) {
        writeDataBytes = (size_t)data;
      }
      else {
        dVar1 = Buffer_resize((Buffer *)&writeDataPtr,(long)(local_1b4 * height));
        if (dVar1 == 0) {
          qpPrintf("ERROR: Failed to pack pixels for writing.\n");
          Buffer_deinit((Buffer *)&writeDataPtr);
          return 0;
        }
        for (local_1b8 = 0; local_1b8 < height; local_1b8 = local_1b8 + 1) {
          memcpy((void *)(compressedBuffer.size + (long)(local_1b4 * local_1b8)),
                 (void *)((long)data + (long)(local_1b8 * stride)),(long)(row * width));
        }
      }
      _pixelSize = (size_t)(local_1b4 * height);
    }
    else if (width_local != 1) {
      pcVar2 = qpLookupString(s_qpImageCompressionModeMap,4,width_local);
      qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n",pcVar2);
      Buffer_deinit((Buffer *)&writeDataPtr);
      return 0;
    }
    int32ToString(width,heightStr + 0x18);
    int32ToString(height,(char *)&attribs[7].intValue);
    lVar3 = (long)compressedBuffer.data._4_4_;
    compressedBuffer.data._4_4_ = compressedBuffer.data._4_4_ + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_1d8,"Name",name);
    *(undefined8 *)(local_178 + lVar3 * 0x20) = local_1d8._0_8_;
    attribs[lVar3].name = (char *)local_1d8._8_8_;
    *(char **)&attribs[lVar3].type = local_1c8;
    attribs[lVar3].stringValue = local_1c0;
    lVar3 = (long)compressedBuffer.data._4_4_;
    compressedBuffer.data._4_4_ = compressedBuffer.data._4_4_ + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_1f8,"Width",heightStr + 0x18);
    *(undefined8 *)(local_178 + lVar3 * 0x20) = local_1f8._0_8_;
    attribs[lVar3].name = (char *)local_1f8._8_8_;
    *(char **)&attribs[lVar3].type = local_1e8;
    attribs[lVar3].stringValue = local_1e0;
    lVar3 = (long)compressedBuffer.data._4_4_;
    compressedBuffer.data._4_4_ = compressedBuffer.data._4_4_ + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_218,"Height",(char *)&attribs[7].intValue);
    *(undefined8 *)(local_178 + lVar3 * 0x20) = local_218._0_8_;
    attribs[lVar3].name = (char *)local_218._8_8_;
    *(char **)&attribs[lVar3].type = local_208;
    attribs[lVar3].stringValue = local_200;
    lVar3 = (long)compressedBuffer.data._4_4_;
    compressedBuffer.data._4_4_ = compressedBuffer.data._4_4_ + 1;
    pcVar2 = qpLookupString(s_qpImageFormatMap,3,imageFormat);
    qpSetStringAttrib((qpXmlAttribute *)local_238,"Format",pcVar2);
    *(undefined8 *)(local_178 + lVar3 * 0x20) = local_238._0_8_;
    attribs[lVar3].name = (char *)local_238._8_8_;
    *(char **)&attribs[lVar3].type = local_228;
    attribs[lVar3].stringValue = local_220;
    lVar3 = (long)compressedBuffer.data._4_4_;
    compressedBuffer.data._4_4_ = compressedBuffer.data._4_4_ + 1;
    pcVar2 = qpLookupString(s_qpImageCompressionModeMap,4,width_local);
    qpSetStringAttrib((qpXmlAttribute *)local_258,"CompressionMode",pcVar2);
    *(undefined8 *)(local_178 + lVar3 * 0x20) = local_258._0_8_;
    attribs[lVar3].name = (char *)local_258._8_8_;
    *(char **)&attribs[lVar3].type = local_248;
    attribs[lVar3].stringValue = local_240;
    if (description != (char *)0x0) {
      lVar3 = (long)compressedBuffer.data._4_4_;
      compressedBuffer.data._4_4_ = compressedBuffer.data._4_4_ + 1;
      qpSetStringAttrib((qpXmlAttribute *)local_278,"Description",description);
      *(undefined8 *)(local_178 + lVar3 * 0x20) = local_278._0_8_;
      attribs[lVar3].name = (char *)local_278._8_8_;
      *(char **)&attribs[lVar3].type = local_268;
      attribs[lVar3].stringValue = local_260;
    }
    deMutex_lock(log->lock);
    dVar1 = qpXmlWriter_startElement
                      (log->writer,"Image",compressedBuffer.data._4_4_,(qpXmlAttribute *)local_178);
    if (((dVar1 == 0) ||
        (dVar1 = qpXmlWriter_writeBase64(log->writer,(deUint8 *)writeDataBytes,_pixelSize),
        dVar1 == 0)) || (dVar1 = qpXmlWriter_endElement(log->writer,"Image"), dVar1 == 0)) {
      qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
      deMutex_unlock(log->lock);
      Buffer_deinit((Buffer *)&writeDataPtr);
      log_local._4_4_ = 0;
    }
    else {
      deMutex_unlock(log->lock);
      Buffer_deinit((Buffer *)&writeDataPtr);
      log_local._4_4_ = 1;
    }
  }
  else {
    log_local._4_4_ = 1;
  }
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_writeImage	(
	qpTestLog*				log,
	const char*				name,
	const char*				description,
	qpImageCompressionMode	compressionMode,
	qpImageFormat			imageFormat,
	int						width,
	int						height,
	int						stride,
	const void*				data)
{
	char			widthStr[32];
	char			heightStr[32];
	qpXmlAttribute	attribs[8];
	int				numAttribs			= 0;
	Buffer			compressedBuffer;
	const void*		writeDataPtr		= DE_NULL;
	size_t			writeDataBytes		= ~(size_t)0;

	DE_ASSERT(log && name);
	DE_ASSERT(deInRange32(width, 1, 16384));
	DE_ASSERT(deInRange32(height, 1, 16384));
	DE_ASSERT(data);

	if (log->flags & QP_TEST_LOG_EXCLUDE_IMAGES)
		return DE_TRUE; /* Image not logged. */

	Buffer_init(&compressedBuffer);

	/* BEST compression mode defaults to PNG. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_BEST)
	{
#if defined(QP_SUPPORT_PNG)
		compressionMode = QP_IMAGE_COMPRESSION_MODE_PNG;
#else
		compressionMode = QP_IMAGE_COMPRESSION_MODE_NONE;
#endif
	}

#if defined(QP_SUPPORT_PNG)
	/* Try storing with PNG compression. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_PNG)
	{
		deBool compressOk = compressImagePNG(&compressedBuffer, imageFormat, width, height, stride, data);
		if (compressOk)
		{
			writeDataPtr	= compressedBuffer.data;
			writeDataBytes	= compressedBuffer.size;
		}
		else
		{
			/* Fall-back to default compression. */
			qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
			compressionMode	= QP_IMAGE_COMPRESSION_MODE_NONE;
		}
	}
#endif

	/* Handle image compression. */
	switch (compressionMode)
	{
		case QP_IMAGE_COMPRESSION_MODE_NONE:
		{
			int pixelSize		= imageFormat == QP_IMAGE_FORMAT_RGB888 ? 3 : 4;
			int packedStride	= pixelSize*width;

			if (packedStride == stride)
				writeDataPtr = data;
			else
			{
				/* Need to re-pack pixels. */
				if (Buffer_resize(&compressedBuffer, (size_t)(packedStride*height)))
				{
					int row;
					for (row = 0; row < height; row++)
						memcpy(&compressedBuffer.data[packedStride*row], &((const deUint8*)data)[row*stride], (size_t)(pixelSize*width));
				}
				else
				{
					qpPrintf("ERROR: Failed to pack pixels for writing.\n");
					Buffer_deinit(&compressedBuffer);
					return DE_FALSE;
				}
			}

			writeDataBytes = (size_t)(packedStride*height);
			break;
		}

#if defined(QP_SUPPORT_PNG)
		case QP_IMAGE_COMPRESSION_MODE_PNG:
			DE_ASSERT(writeDataPtr); /* Already handled. */
			break;
#endif

		default:
			qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
			Buffer_deinit(&compressedBuffer);
			return DE_FALSE;
	}

	/* Fill in attributes. */
	int32ToString(width, widthStr);
	int32ToString(height, heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Width", widthStr);
	attribs[numAttribs++] = qpSetStringAttrib("Height", heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Format", QP_LOOKUP_STRING(s_qpImageFormatMap, imageFormat));
	attribs[numAttribs++] = qpSetStringAttrib("CompressionMode", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
	if (description) attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* \note Log lock is acquired after compression! */
	deMutex_lock(log->lock);

	/* <Image ID="result" Name="Foobar" Width="640" Height="480" Format="RGB888" CompressionMode="None">base64 data</Image> */
	if (!qpXmlWriter_startElement(log->writer, "Image", numAttribs, attribs) ||
		!qpXmlWriter_writeBase64(log->writer, (const deUint8*)writeDataPtr, writeDataBytes) ||
		!qpXmlWriter_endElement(log->writer, "Image"))
	{
		qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		Buffer_deinit(&compressedBuffer);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);

	/* Free compressed data if allocated. */
	Buffer_deinit(&compressedBuffer);

	return DE_TRUE;
}